

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O2

bool __thiscall
draco::PlyDecoder::ReadPropertiesToAttribute<int>
          (PlyDecoder *this,
          vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          *properties,PointAttribute *attribute,int num_vertices)

{
  pointer ppPVar1;
  size_t __n;
  int iVar2;
  PlyPropertyReader<int> *this_00;
  size_type __n_00;
  int prop;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  allocator_type local_65;
  uint local_64;
  vector<int,_std::allocator<int>_> memory;
  vector<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  readers;
  
  readers.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  readers.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  readers.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_64 = num_vertices;
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ::reserve(&readers,(long)(properties->
                           super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(properties->
                           super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar4 = 0;
  while( true ) {
    ppPVar1 = (properties->
              super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    __n_00 = (long)(properties->
                   super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
    if (__n_00 <= uVar4) break;
    this_00 = (PlyPropertyReader<int> *)operator_new(0x28);
    PlyPropertyReader<int>::PlyPropertyReader(this_00,ppPVar1[uVar4]);
    memory.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)this_00;
    std::
    vector<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>>>
    ::
    emplace_back<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>>
              ((vector<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>>>
                *)&readers,
               (unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>
                *)&memory);
    std::
    unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>
    ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>
                   *)&memory);
    uVar4 = uVar4 + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&memory,__n_00,&local_65);
  uVar4 = (ulong)local_64;
  for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    for (uVar3 = 0;
        uVar3 < (ulong)((long)(properties->
                              super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(properties->
                              super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
      iVar2 = std::function<int_(int)>::operator()
                        (&(readers.
                           super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_t.
                           super___uniq_ptr_impl<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_draco::PlyPropertyReader<int>_*,_std::default_delete<draco::PlyPropertyReader<int>_>_>
                           .super__Head_base<0UL,_draco::PlyPropertyReader<int>_*,_false>.
                          _M_head_impl)->convert_value_func_,(int)uVar5);
      memory.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar3] = iVar2;
    }
    __n = (attribute->super_GeometryAttribute).byte_stride_;
    memcpy((void *)(__n * uVar5 +
                   (long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start),
           memory.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,__n);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&memory.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ::~vector(&readers);
  return true;
}

Assistant:

bool PlyDecoder::ReadPropertiesToAttribute(
    const std::vector<const PlyProperty *> &properties,
    PointAttribute *attribute, int num_vertices) {
  std::vector<std::unique_ptr<PlyPropertyReader<DataTypeT>>> readers;
  readers.reserve(properties.size());
  for (int prop = 0; prop < properties.size(); ++prop) {
    readers.push_back(std::unique_ptr<PlyPropertyReader<DataTypeT>>(
        new PlyPropertyReader<DataTypeT>(properties[prop])));
  }
  std::vector<DataTypeT> memory(properties.size());
  for (PointIndex::ValueType i = 0; i < static_cast<uint32_t>(num_vertices);
       ++i) {
    for (int prop = 0; prop < properties.size(); ++prop) {
      memory[prop] = readers[prop]->ReadValue(i);
    }
    attribute->SetAttributeValue(AttributeValueIndex(i), memory.data());
  }
  return true;
}